

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t
duckdb::TimeBucket::OffsetTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  BucketWidthType BVar1;
  timestamp_t tVar2;
  NotImplementedException *this;
  interval_t bucket_width_00;
  allocator local_51;
  string local_50 [32];
  
  bucket_width_00._0_8_ = bucket_width.micros;
  bucket_width_00.micros = ts.value;
  BVar1 = ClassifyBucketWidthErrorThrow(bucket_width._0_8_,bucket_width_00);
  if (BVar1 == CONVERTIBLE_TO_MONTHS) {
    tVar2 = OffsetWidthConvertibleToMonthsTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                      (bucket_width,ts,offset);
    return (timestamp_t)tVar2.value;
  }
  if (BVar1 == CONVERTIBLE_TO_MICROS) {
    tVar2 = OffsetWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                      (bucket_width,ts,offset);
    return (timestamp_t)tVar2.value;
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_50,"Bucket type not implemented for TIME_BUCKET",&local_51);
  duckdb::NotImplementedException::NotImplementedException(this,local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OffsetWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OffsetWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                offset);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}